

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O3

ssize_t __thiscall
amrex::FluxRegister::read(FluxRegister *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  int ncomp_in;
  int fine_level_in;
  IntVect ratio_in;
  int local_34;
  int local_30;
  IntVect local_2c;
  
  if (this->ncomp < 0) {
    Abort_host("FluxRegister::read: FluxRegister not defined");
  }
  local_2c.vect[0] = 0;
  local_2c.vect[1] = 0;
  local_2c.vect[2] = 0;
  amrex::operator>>((istream *)__buf,&local_2c);
  std::istream::operator>>((istream *)__buf,&local_30);
  std::istream::operator>>((istream *)__buf,&local_34);
  if ((((local_2c.vect[0] != (this->ratio).vect[0]) || (local_2c.vect[1] != (this->ratio).vect[1]))
      || (local_2c.vect[2] != (this->ratio).vect[2])) ||
     ((local_30 != this->fine_level || (local_34 != this->ncomp)))) {
    Abort_host("FluxRegister::read: predefined FluxRegister does not match the one in istream");
  }
  sVar1 = BndryRegister::read(&this->super_BndryRegister,__fd,__buf,__nbytes);
  return sVar1;
}

Assistant:

void
FluxRegister::read (const std::string& name, std::istream& is)
{
    if (ncomp < 0) {
        amrex::Abort("FluxRegister::read: FluxRegister not defined");
    }

    IntVect ratio_in;
    int fine_level_in;
    int ncomp_in;

    is >> ratio_in;
    is >> fine_level_in;
    is >> ncomp_in;

    if (ratio_in != ratio || fine_level_in != fine_level || ncomp_in != ncomp) {
        amrex::Abort("FluxRegister::read: predefined FluxRegister does not match the one in istream");
    }

    BndryRegister* br = this;

    br->read(name,is);
}